

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.c
# Opt level: O2

void transfer_lights(level *oldlev,level *newlev,uint obj_id)

{
  ls_t *plVar1;
  boolean bVar2;
  ls_t *plVar3;
  
  if (newlev == oldlev) {
    return;
  }
  plVar1 = (ls_t *)&oldlev->lev_lights;
LAB_001ac4b9:
  do {
    while( true ) {
      do {
        plVar3 = plVar1;
        plVar1 = plVar3->next;
        if (plVar1 == (ls_t *)0x0) {
          return;
        }
        if (plVar1->type == 1) goto LAB_001ac4e0;
      } while (plVar1->type != 0);
      if (obj_id != 0) break;
      bVar2 = obj_is_local((obj *)plVar1->id);
      if (bVar2 == '\0') goto LAB_001ac4fd;
      plVar1 = plVar3->next;
    }
  } while (((obj *)plVar1->id)->o_id != obj_id);
LAB_001ac4fd:
  plVar3->next = plVar1->next;
  plVar1->next = newlev->lev_lights;
  newlev->lev_lights = plVar1;
  plVar1 = plVar3;
  goto LAB_001ac4b9;
LAB_001ac4e0:
  if ((obj_id != 0) || ('\0' < *(char *)((long)plVar1->id + 0x4f))) goto LAB_001ac4b9;
  goto LAB_001ac4fd;
}

Assistant:

void transfer_lights(struct level *oldlev, struct level *newlev, unsigned int obj_id)
{
    light_source **prev, *curr;
    boolean transfer;

    if (newlev == oldlev)
	return;

    for (prev = &oldlev->lev_lights; (curr = *prev) != 0; ) {
	switch (curr->type) {
	    case LS_OBJECT:
		if (obj_id)
		    transfer = (((struct obj *)curr->id)->o_id == obj_id);
		else
		    transfer = !obj_is_local((struct obj *)curr->id);
		break;
	    case LS_MONSTER:
		if (obj_id)
		    transfer = FALSE;
		else
		    transfer = !mon_is_local((struct monst *)curr->id);
		break;
	    default:
		transfer = FALSE;
		break;
	}
	/* associate light sources with the new level */
	if (transfer) {
	    *prev = curr->next;
	    curr->next = newlev->lev_lights;
	    newlev->lev_lights = curr;
	} else {
	    prev = &(*prev)->next;
	}
    }
}